

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageLiteGenerator local_88;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar1->extension_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)&local_88,
                 (FieldDescriptor *)(&pDVar1->extensions_->super_SymbolBase + lVar2),this->context_)
      ;
      ImmutableExtensionLiteGenerator::GenerateRegistrationCode
                ((ImmutableExtensionLiteGenerator *)&local_88,printer);
      ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)&local_88);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0x58;
    } while (lVar3 < pDVar1->extension_count_);
  }
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar1->nested_type_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableMessageLiteGenerator
                (&local_88,(Descriptor *)(&pDVar1->nested_types_->super_SymbolBase + lVar2),
                 this->context_);
      GenerateExtensionRegistrationCode(&local_88,printer);
      local_88.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&PTR__ImmutableMessageLiteGenerator_01970578;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
      ~FieldGeneratorMap(&local_88.field_generators_);
      MessageGenerator::~MessageGenerator(&local_88.super_MessageGenerator);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa0;
    } while (lVar3 < pDVar1->nested_type_count_);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}